

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O3

void __thiscall QLCDNumber::setDigitCount(QLCDNumber *this,int numDigits)

{
  QString *this_00;
  uint uVar1;
  long lVar2;
  QArrayData *pQVar3;
  long lVar4;
  int iVar5;
  byte *pbVar6;
  byte bVar7;
  char16_t *pcVar8;
  qsizetype extraout_RDX;
  ulong i;
  uint uVar10;
  QBitArray *pQVar11;
  QBitArray *pQVar12;
  long in_FS_OFFSET;
  R_conflict2 RVar13;
  QString local_58;
  long local_38;
  qsizetype qVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  if (numDigits < 100) {
    if (numDigits < 0) {
      setDigitCount(this);
      numDigits = 0;
    }
  }
  else {
    setDigitCount(this);
    numDigits = 99;
  }
  this_00 = (QString *)(lVar2 + 0x290);
  if (*(long *)(lVar2 + 0x298) == 0) {
    *(int *)(lVar2 + 0x278) = numDigits;
    QString::fill((QChar)(char16_t)this_00,0x20);
    QBitArray::fill((QBitArray *)(lVar2 + 0x2a8),false,(long)*(int *)(lVar2 + 0x278));
    iVar5 = *(int *)(lVar2 + 0x278);
    if ((*(int **)(lVar2 + 0x290) == (int *)0x0) || (1 < **(int **)(lVar2 + 0x290))) {
      QString::reallocData((longlong)this_00,(AllocationOption)*(undefined8 *)(lVar2 + 0x2a0));
    }
    *(undefined2 *)(*(long *)(lVar2 + 0x298) + -2 + (long)iVar5 * 2) = 0x30;
  }
  else {
    uVar1 = *(uint *)(lVar2 + 0x278);
    i = (ulong)uVar1;
    iVar5 = numDigits - uVar1;
    if (iVar5 != 0) {
      if (iVar5 == 0 || numDigits < (int)uVar1) {
        QString::right(&local_58,this_00,(qsizetype)(ulong)(uint)numDigits);
        pQVar3 = *(QArrayData **)(lVar2 + 0x290);
        pcVar8 = *(char16_t **)(lVar2 + 0x298);
        *(Data **)(lVar2 + 0x290) = local_58.d.d;
        *(char16_t **)(lVar2 + 0x298) = local_58.d.ptr;
        qVar9 = *(qsizetype *)(lVar2 + 0x2a0);
        *(qsizetype *)(lVar2 + 0x2a0) = local_58.d.size;
        local_58.d.d = (Data *)pQVar3;
        local_58.d.ptr = pcVar8;
        local_58.d.size = qVar9;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
        pQVar3 = *(QArrayData **)(lVar2 + 0x2a8);
        lVar4 = *(long *)(lVar2 + 0x2b0);
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QBitArray::resize((longlong)(lVar2 + 0x2a8));
        if (numDigits != 0) {
          pQVar12 = (QBitArray *)0x0;
          do {
            bVar7 = *(byte *)(lVar4 + 1 + (long)((int)((uVar1 - numDigits) + (int)pQVar12) >> 3));
            RVar13 = QBitArray::bitLocation<QBitArray>((QBitArray *)(lVar2 + 0x2a8),pQVar12,i);
            pbVar6 = (byte *)RVar13.byte;
            if ((bVar7 >> ((uint)(byte)((char)uVar1 - (char)numDigits) + (int)pQVar12 & 7) & 1) == 0
               ) {
              bVar7 = ~RVar13.bitMask & *pbVar6;
            }
            else {
              bVar7 = RVar13.bitMask | *pbVar6;
            }
            i = CONCAT71(RVar13._9_7_,bVar7);
            *pbVar6 = bVar7;
            pQVar12 = (QBitArray *)((long)&(pQVar12->d).d.d + 1);
          } while ((QBitArray *)(ulong)(uint)numDigits != pQVar12);
        }
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,1,0x10);
          }
        }
      }
      else {
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char16_t *)0x0;
        local_58.d.size = 0;
        QString::fill((QChar)(char16_t)&local_58,0x20);
        pcVar8 = local_58.d.ptr;
        if (local_58.d.ptr == (char16_t *)0x0) {
          pcVar8 = (char16_t *)&QString::_empty;
        }
        QString::insert((longlong)this_00,(QChar *)0x0,(longlong)pcVar8);
        pQVar12 = (QBitArray *)(lVar2 + 0x2a8);
        pQVar11 = (QBitArray *)(ulong)(uint)numDigits;
        QBitArray::resize((longlong)pQVar12);
        qVar9 = extraout_RDX;
        uVar10 = uVar1;
        if (0 < (int)uVar1) {
          do {
            uVar10 = uVar10 - 1;
            pQVar11 = (QBitArray *)((long)&pQVar11[-1].d.d.size + 7);
            bVar7 = *(byte *)(*(long *)(lVar2 + 0x2b0) + 1 + (long)((int)uVar10 >> 3));
            RVar13 = QBitArray::bitLocation<QBitArray>(pQVar12,pQVar11,qVar9);
            pbVar6 = (byte *)RVar13.byte;
            if ((bVar7 >> (uVar10 & 7) & 1) == 0) {
              bVar7 = ~RVar13.bitMask & *pbVar6;
            }
            else {
              bVar7 = RVar13.bitMask | *pbVar6;
            }
            qVar9 = CONCAT71(RVar13._9_7_,bVar7);
            *pbVar6 = bVar7;
          } while ((long)iVar5 < (long)pQVar11);
        }
        if (0 < iVar5) {
          pQVar11 = (QBitArray *)0x0;
          do {
            RVar13 = QBitArray::bitLocation<QBitArray>(pQVar12,pQVar11,qVar9);
            qVar9 = CONCAT71(RVar13._9_7_,~RVar13.bitMask);
            *RVar13.byte = *RVar13.byte & ~RVar13.bitMask;
            pQVar11 = (QBitArray *)((long)&(pQVar11->d).d.d + 1);
          } while ((QBitArray *)(long)iVar5 != pQVar11);
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      *(int *)(lVar2 + 0x278) = numDigits;
      if (uVar1 == 0) {
        display(this,*(double *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x280));
      }
      QWidget::update((QWidget *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::setDigitCount(int numDigits)
{
    Q_D(QLCDNumber);
    if (Q_UNLIKELY(numDigits > 99)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Max 99 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 99;
    }
    if (Q_UNLIKELY(numDigits < 0)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Min 0 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 0;
    }
    if (d->digitStr.isNull()) {                  // from constructor
        d->ndigits = numDigits;
        d->digitStr.fill(u' ', d->ndigits);
        d->points.fill(0, d->ndigits);
        d->digitStr[d->ndigits - 1] = u'0'; // "0" is the default number
    } else {
        bool doDisplay = d->ndigits == 0;
        if (numDigits == d->ndigits)             // no change
            return;
        int i;
        int dif;
        if (numDigits > d->ndigits) {            // expand
            dif = numDigits - d->ndigits;
            QString buf;
            buf.fill(u' ', dif);
            d->digitStr.insert(0, buf);
            d->points.resize(numDigits);
            for (i=numDigits-1; i>=dif; i--)
                d->points.setBit(i, d->points.testBit(i-dif));
            for (i=0; i<dif; i++)
                d->points.clearBit(i);
        } else {                                        // shrink
            dif = d->ndigits - numDigits;
            d->digitStr = d->digitStr.right(numDigits);
            QBitArray tmpPoints = d->points;
            d->points.resize(numDigits);
            for (i=0; i<numDigits; i++)
                d->points.setBit(i, tmpPoints.testBit(i+dif));
        }
        d->ndigits = numDigits;
        if (doDisplay)
            display(value());
        update();
    }
}